

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Order.h
# Opt level: O0

void __thiscall Order::execute(Order *this,double price,long quantity)

{
  long quantity_local;
  double price_local;
  Order *this_local;
  
  this->m_avgExecutedPrice =
       ((double)quantity * price + this->m_avgExecutedPrice * (double)this->m_executedQuantity) /
       (double)(quantity + this->m_executedQuantity);
  this->m_openQuantity = this->m_openQuantity - quantity;
  this->m_executedQuantity = quantity + this->m_executedQuantity;
  this->m_lastExecutedPrice = price;
  this->m_lastExecutedQuantity = quantity;
  return;
}

Assistant:

void execute(double price, long quantity) {
    m_avgExecutedPrice
        = ((quantity * price) + (m_avgExecutedPrice * m_executedQuantity)) / (quantity + m_executedQuantity);

    m_openQuantity -= quantity;
    m_executedQuantity += quantity;
    m_lastExecutedPrice = price;
    m_lastExecutedQuantity = quantity;
  }